

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lengauer_tarjan.cpp
# Opt level: O0

int __thiscall LengauerTarjan::init(LengauerTarjan *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  uint uVar2;
  int extraout_EAX;
  size_type sVar3;
  ulong uVar4;
  reference pvVar5;
  uint *puVar6;
  reference pvVar7;
  int o;
  int e;
  uint j;
  int i;
  int n;
  allocator_type *in_stack_fffffffffffffd38;
  allocator_type *__a;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd40;
  vector<int,_std::allocator<int>_> *this_00;
  size_type in_stack_fffffffffffffd48;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd50;
  int *this_01;
  allocator_type local_1ad;
  undefined4 local_1ac;
  undefined4 local_16c;
  vector<int,_std::allocator<int>_> local_168;
  undefined4 local_14c;
  undefined4 local_12c;
  undefined4 local_10c;
  undefined4 local_ec;
  undefined4 local_cc;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  int local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  int local_c;
  LengauerTarjan *local_8;
  
  local_8 = this;
  sVar3 = std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::size(&this->in);
  local_c = (int)sVar3;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2b257b);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x2b2590);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
           in_stack_fffffffffffffd38);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::operator=((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)in_stack_fffffffffffffd40,
              (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)in_stack_fffffffffffffd38);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)in_stack_fffffffffffffd40);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x2b25ed);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffd40);
  local_98 = 0;
  uStack_90 = 0;
  local_88 = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2b2636);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x2b264b);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
           in_stack_fffffffffffffd38);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::operator=((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)in_stack_fffffffffffffd40,
              (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)in_stack_fffffffffffffd38);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)in_stack_fffffffffffffd40);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x2b26a0);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffd40);
  for (local_a0 = 0; local_a0 < local_c; local_a0 = local_a0 + 1) {
    local_a4 = 0;
    while( true ) {
      uVar4 = (ulong)local_a4;
      pvVar5 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->ou,(long)local_a0);
      sVar3 = std::vector<int,_std::allocator<int>_>::size(pvVar5);
      if (sVar3 <= uVar4) break;
      pvVar5 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->ou,(long)local_a0);
      puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(ulong)local_a4);
      local_a8 = *puVar6;
      uVar2 = (*this->_vptr_LengauerTarjan[10])(this,(ulong)local_a8);
      if ((uVar2 & 1) == 0) {
        pvVar5 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&this->en,(long)(int)local_a8);
        puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](pvVar5,1);
        local_ac = *puVar6;
        uVar2 = (*this->_vptr_LengauerTarjan[9])(this,(ulong)local_ac);
        iVar1 = local_a0;
        if ((uVar2 & 1) == 0) {
          pvVar5 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](&this->ou,(long)local_a0);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(ulong)local_a4);
          pvVar5 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](&this->en,(long)*pvVar7);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,1);
          if (iVar1 != *pvVar7) {
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[](&succs,(long)local_a0);
            pvVar5 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[](&this->ou,(long)local_a0);
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(ulong)local_a4);
            pvVar5 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[](&this->en,(long)*pvVar7);
            std::vector<int,_std::allocator<int>_>::operator[](pvVar5,1);
            std::vector<int,_std::allocator<int>_>::push_back
                      (in_stack_fffffffffffffd40,(value_type_conflict *)in_stack_fffffffffffffd38);
          }
        }
      }
      local_a4 = local_a4 + 1;
    }
  }
  local_cc = 0xffffffff;
  std::allocator<int>::allocator((allocator<int> *)0x2b297b);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (value_type_conflict *)in_stack_fffffffffffffd40,
             (allocator_type *)in_stack_fffffffffffffd38);
  std::vector<int,_std::allocator<int>_>::operator=
            (in_stack_fffffffffffffd40,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd38);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffd40);
  std::allocator<int>::~allocator((allocator<int> *)0x2b29dd);
  local_ec = 0xffffffff;
  std::allocator<int>::allocator((allocator<int> *)0x2b2a0d);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (value_type_conflict *)in_stack_fffffffffffffd40,
             (allocator_type *)in_stack_fffffffffffffd38);
  std::vector<int,_std::allocator<int>_>::operator=
            (in_stack_fffffffffffffd40,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd38);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffd40);
  std::allocator<int>::~allocator((allocator<int> *)0x2b2a6f);
  local_10c = 0xffffffff;
  std::allocator<int>::allocator((allocator<int> *)0x2b2a9f);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (value_type_conflict *)in_stack_fffffffffffffd40,
             (allocator_type *)in_stack_fffffffffffffd38);
  std::vector<int,_std::allocator<int>_>::operator=
            (in_stack_fffffffffffffd40,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd38);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffd40);
  std::allocator<int>::~allocator((allocator<int> *)0x2b2afe);
  local_12c = 0xffffffff;
  std::allocator<int>::allocator((allocator<int> *)0x2b2b28);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (value_type_conflict *)in_stack_fffffffffffffd40,
             (allocator_type *)in_stack_fffffffffffffd38);
  std::vector<int,_std::allocator<int>_>::operator=
            (in_stack_fffffffffffffd40,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd38);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffd40);
  std::allocator<int>::~allocator((allocator<int> *)0x2b2b81);
  this->count = -1;
  local_14c = 0xffffffff;
  std::allocator<int>::allocator((allocator<int> *)0x2b2bbd);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (value_type_conflict *)in_stack_fffffffffffffd40,
             (allocator_type *)in_stack_fffffffffffffd38);
  std::vector<int,_std::allocator<int>_>::operator=
            (in_stack_fffffffffffffd40,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd38);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffd40);
  std::allocator<int>::~allocator((allocator<int> *)0x2b2c16);
  local_16c = 0xffffffff;
  std::allocator<int>::allocator((allocator<int> *)0x2b2c40);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (value_type_conflict *)in_stack_fffffffffffffd40,
             (allocator_type *)in_stack_fffffffffffffd38);
  this_00 = &local_168;
  std::vector<int,_std::allocator<int>_>::operator=
            (this_00,(vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd38);
  std::vector<int,_std::allocator<int>_>::~vector(this_00);
  std::allocator<int>::~allocator((allocator<int> *)0x2b2c99);
  sVar3 = (size_type)local_c;
  this_01 = &this->root;
  std::allocator<int>::allocator((allocator<int> *)0x2b2cc9);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)this_01,sVar3,(value_type_conflict *)this_00,
             (allocator_type *)in_stack_fffffffffffffd38);
  std::vector<int,_std::allocator<int>_>::operator=
            (this_00,(vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd38);
  std::vector<int,_std::allocator<int>_>::~vector(this_00);
  std::allocator<int>::~allocator((allocator<int> *)0x2b2d15);
  local_1ac = 0;
  __a = &local_1ad;
  std::allocator<int>::allocator((allocator<int> *)0x2b2d3f);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)this_01,sVar3,(value_type_conflict *)this_00,__a);
  std::vector<int,_std::allocator<int>_>::operator=
            (this_00,(vector<int,_std::allocator<int>_> *)__a);
  std::vector<int,_std::allocator<int>_>::~vector(this_00);
  std::allocator<int>::~allocator((allocator<int> *)0x2b2d8e);
  return extraout_EAX;
}

Assistant:

void LengauerTarjan::init() {
	const int n = static_cast<int>(in.size());
	preds = std::vector<std::vector<int> >(n, std::vector<int>());
	succs = std::vector<std::vector<int> >(n, std::vector<int>());
	for (int i = 0; i < n; i++) {
		// succs.push_back(vector<int>());
		// cout <<"Succs of "<<i<<": ";
		for (unsigned int j = 0; j < ou[i].size(); j++) {
			const int e = ou[i][j];
			if (ignore_edge(e)) {
				continue;
			}
			const int o = en[e][1];
			if (ignore_node(o)) {
				continue;
			}
			if (i != en[ou[i][j]][1]) {
				succs[i].push_back(en[ou[i][j]][1]);
				// cout <<en[ou[i][j]][1]<<", ";
			}
		}
		// cout<<endl;
	}

	parent = std::vector<int>(n, -1);
	vertex = std::vector<int>(n, -1);
	semi = std::vector<int>(n, -1);
	idom = std::vector<int>(n, -1);

	count = -1;

	ancestor = std::vector<int>(n, -1);
	label = std::vector<int>(n, -1);

	child = std::vector<int>(n, root);
	size_ = std::vector<int>(n, 0);
}